

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QString * __thiscall
QAccessibleComboBox::localizedActionDescription(QAccessibleComboBox *this,QString *actionName)

{
  bool bVar1;
  QString *in_RDX;
  QString *in_RDI;
  QString *in_stack_ffffffffffffffc8;
  int n;
  QString *s;
  
  s = in_RDI;
  QAccessibleActionInterface::showMenuAction();
  bVar1 = ::operator==(in_RDI,in_stack_ffffffffffffffc8);
  n = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (!bVar1) {
    QAccessibleActionInterface::pressAction();
    bVar1 = ::operator==(in_RDI,in_RDX);
    n = (int)((ulong)in_RDX >> 0x20);
    if (!bVar1) {
      QString::QString((QString *)0x7d55ca);
      return s;
    }
  }
  QComboBox::tr((char *)s,(char *)in_RDI,n);
  return s;
}

Assistant:

QString QAccessibleComboBox::localizedActionDescription(const QString &actionName) const
{
    if (actionName == showMenuAction() || actionName == pressAction())
        return QComboBox::tr("Open the combo box selection popup");
    return QString();
}